

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

int bcf_translate(bcf_hdr_t *dst_hdr,bcf_hdr_t *src_hdr,bcf1_t *line)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  bcf_idpair_t *pbVar4;
  char *__s2;
  int *piVar5;
  bcf_info_t *pbVar6;
  bcf_fmt_t *pbVar7;
  int iVar8;
  int *piVar9;
  ulong uVar10;
  char *pcVar11;
  bcf_hdr_t *hdr;
  bcf_hdr_t *pbVar12;
  long lVar13;
  undefined1 uVar14;
  size_t sVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  bool bVar19;
  kstring_t str;
  kstring_t local_68;
  bcf_hdr_t *local_48;
  bcf_hdr_t *local_40;
  bcf1_t *local_38;
  
  pbVar12 = (bcf_hdr_t *)(ulong)(uint)line->errcode;
  if (line->errcode != 0) {
    bcf_translate_cold_1();
    hdr = bcf_hdr_init("r");
    pcVar11 = bcf_hdr_fmt_text(pbVar12,1,(int *)0x0);
    bcf_hdr_parse(hdr,pcVar11);
    free(pcVar11);
    return (int)hdr;
  }
  if (src_hdr->ntransl != -1) {
    local_48 = src_hdr;
    if (src_hdr->ntransl == 0) {
      lVar13 = 0;
      local_40 = dst_hdr;
      local_38 = line;
      do {
        iVar8 = src_hdr->n[lVar13];
        piVar9 = (int *)malloc((long)iVar8 * 4);
        local_48->transl[lVar13] = piVar9;
        src_hdr = local_48;
        if (0 < (long)iVar8) {
          pbVar4 = local_48->id[lVar13];
          lVar17 = 0;
          lVar18 = 0;
          pbVar12 = local_40;
          do {
            pcVar11 = *(char **)((long)&pbVar4->key + lVar17);
            if ((pcVar11 == (char *)0x0) ||
               (__s2 = *(char **)((long)&pbVar12->id[lVar13]->key + lVar17), __s2 == (char *)0x0)) {
              piVar9[lVar18] = -1;
            }
            else if ((lVar18 < pbVar12->n[lVar13]) &&
                    (iVar8 = strcmp(pcVar11,__s2), pbVar12 = local_40, iVar8 == 0)) {
              piVar9[lVar18] = -1;
              src_hdr = local_48;
            }
            else {
              iVar8 = bcf_hdr_id2int(pbVar12,(int)lVar13,pcVar11);
              piVar9[lVar18] = iVar8;
              local_48->ntransl = local_48->ntransl + 1;
              src_hdr = local_48;
              pbVar12 = local_40;
            }
            lVar18 = lVar18 + 1;
            lVar17 = lVar17 + 0x10;
          } while (lVar18 < src_hdr->n[lVar13]);
        }
        bVar19 = lVar13 == 0;
        lVar13 = lVar13 + 1;
      } while (bVar19);
      if (src_hdr->ntransl == 0) {
        free(src_hdr->transl[0]);
        local_48->transl[0] = (int *)0x0;
        free(local_48->transl[1]);
        local_48->transl[1] = (int *)0x0;
        local_48->ntransl = -1;
        src_hdr = local_48;
      }
      line = local_38;
      if (src_hdr->ntransl == -1) {
        return 0;
      }
    }
    bcf_unpack(line,0xf);
    if (-1 < local_48->transl[1][line->rid]) {
      line->rid = local_48->transl[1][line->rid];
    }
    if (0 < (line->d).n_flt) {
      piVar9 = (line->d).flt;
      piVar5 = local_48->transl[0];
      lVar13 = 0;
      do {
        if (-1 < piVar5[piVar9[lVar13]]) {
          piVar9[lVar13] = piVar5[piVar9[lVar13]];
        }
        piVar1 = &(line->d).shared_dirty;
        *(byte *)piVar1 = (byte)*piVar1 | 4;
        lVar13 = lVar13 + 1;
      } while (lVar13 < (line->d).n_flt);
    }
    pbVar12 = local_48;
    if (*(short *)&line->field_0x10 != 0) {
      lVar13 = 0x1c;
      uVar16 = 0;
      do {
        pbVar6 = (line->d).info;
        uVar2 = *(uint *)((long)pbVar6 + lVar13 + -0x1c);
        uVar3 = pbVar12->transl[0][(int)uVar2];
        if (-1 < (int)uVar3) {
          iVar8 = 3 - (uint)(uVar3 < 0x8000);
          if (uVar3 < 0x80) {
            iVar8 = 1;
          }
          bVar19 = uVar3 < 0x80;
          if (0x7f < uVar2) {
            bVar19 = 3 - (uint)(uVar2 < 0x8000) == iVar8;
          }
          if (bVar19) {
            *(uint *)((long)pbVar6 + lVar13 + -0x1c) = uVar3;
            lVar17 = *(long *)((long)pbVar6 + lVar13 + -0xc);
            lVar18 = -(ulong)(*(uint *)((long)&pbVar6->key + lVar13) & 0x7fffffff);
            if (iVar8 == 2) {
              *(short *)(lVar17 + lVar18) = (short)uVar3;
            }
            else if (iVar8 == 1) {
              *(char *)(lVar17 + 1 + lVar18) = (char)uVar3;
            }
            else {
              *(uint *)(lVar17 + lVar18) = uVar3;
            }
          }
          else {
            if (*(int *)((long)&pbVar6->key + lVar13) < 0) {
              __assert_fail("!info->vptr_free",
                            "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                            ,0x926,"int bcf_translate(const bcf_hdr_t *, bcf_hdr_t *, bcf1_t *)");
            }
            local_68.l = 0;
            local_68.m = 0;
            local_68.s = (char *)0x0;
            bcf_enc_int1(&local_68,uVar3);
            bcf_enc_size(&local_68,*(int *)((long)pbVar6 + lVar13 + -0x14),
                         *(int *)((long)pbVar6 + lVar13 + -0x18));
            *(uint *)((long)&pbVar6->key + lVar13) =
                 *(uint *)((long)&pbVar6->key + lVar13) & 0x80000000 | (uint)local_68.l & 0x7fffffff
            ;
            pbVar12 = *(bcf_hdr_t **)((long)pbVar6 + lVar13 + -0xc);
            sVar15 = (size_t)*(int *)((long)pbVar6 + lVar13 + -4);
            uVar10 = local_68.l + sVar15 + 1;
            pcVar11 = local_68.s;
            if (uVar10 < local_68.m) {
LAB_0011dd39:
              local_68.s = pcVar11;
              memcpy(local_68.s + local_68.l,pbVar12,sVar15);
              local_68.l = sVar15 + local_68.l;
              local_68.s[local_68.l] = '\0';
            }
            else {
              uVar10 = uVar10 >> 1 | uVar10;
              uVar10 = uVar10 >> 2 | uVar10;
              uVar10 = uVar10 >> 4 | uVar10;
              uVar10 = uVar10 >> 8 | uVar10;
              local_68.m = (uVar10 >> 0x10 | uVar10) + 1;
              local_40 = pbVar12;
              pcVar11 = (char *)realloc(local_68.s,local_68.m);
              pbVar12 = local_40;
              if (pcVar11 != (char *)0x0) goto LAB_0011dd39;
            }
            uVar2 = *(uint *)((long)&pbVar6->key + lVar13);
            *(char **)((long)pbVar6 + lVar13 + -0xc) = local_68.s + (uVar2 & 0x7fffffff);
            *(uint *)((long)&pbVar6->key + lVar13) = uVar2 | 0x80000000;
            *(uint *)((long)pbVar6 + lVar13 + -0x1c) = uVar3;
            piVar9 = &(line->d).shared_dirty;
            *(byte *)piVar9 = (byte)*piVar9 | 8;
            pbVar12 = local_48;
          }
        }
        uVar16 = uVar16 + 1;
        lVar13 = lVar13 + 0x20;
      } while (uVar16 < *(ushort *)&line->field_0x10);
    }
    if (line->field_0x14 != '\0') {
      lVar13 = 0x1c;
      uVar16 = 0;
      do {
        pbVar7 = (line->d).fmt;
        uVar2 = *(uint *)((long)pbVar7 + lVar13 + -0x1c);
        uVar3 = pbVar12->transl[0][(int)uVar2];
        if (-1 < (int)uVar3) {
          iVar8 = 3 - (uint)(uVar3 < 0x8000);
          if (uVar3 < 0x80) {
            iVar8 = 1;
          }
          bVar19 = uVar3 < 0x80;
          if (0x7f < uVar2) {
            bVar19 = 3 - (uint)(uVar2 < 0x8000) == iVar8;
          }
          if (bVar19) {
            *(uint *)((long)pbVar7 + lVar13 + -0x1c) = uVar3;
            lVar17 = *(long *)((long)pbVar7 + lVar13 + -0xc);
            uVar10 = (ulong)(*(uint *)((long)&pbVar7->id + lVar13) & 0x7fffffff);
            *(char *)((lVar17 - uVar10) + 1) = (char)uVar3;
            if (iVar8 != 1) {
              lVar18 = -uVar10;
              uVar14 = (undefined1)(uVar3 >> 8);
              if (iVar8 == 2) {
                *(undefined1 *)(lVar17 + 2 + lVar18) = uVar14;
              }
              else {
                *(undefined1 *)(lVar17 + 2 + lVar18) = uVar14;
                *(char *)(lVar17 + 3 + lVar18) = (char)(uVar3 >> 0x10);
                *(char *)(lVar17 + 4 + lVar18) = (char)(uVar3 >> 0x18);
              }
            }
          }
          else {
            if (*(int *)((long)&pbVar7->id + lVar13) < 0) {
              __assert_fail("!fmt->p_free",
                            "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                            ,0x946,"int bcf_translate(const bcf_hdr_t *, bcf_hdr_t *, bcf1_t *)");
            }
            local_68.l = 0;
            local_68.m = 0;
            local_68.s = (char *)0x0;
            bcf_enc_int1(&local_68,uVar3);
            bcf_enc_size(&local_68,*(int *)((long)pbVar7 + lVar13 + -0x18),
                         *(int *)((long)pbVar7 + lVar13 + -0x10));
            *(uint *)((long)&pbVar7->id + lVar13) =
                 *(uint *)((long)&pbVar7->id + lVar13) & 0x80000000 | (uint)local_68.l & 0x7fffffff;
            pbVar12 = *(bcf_hdr_t **)((long)pbVar7 + lVar13 + -0xc);
            sVar15 = (size_t)*(int *)((long)pbVar7 + lVar13 + -4);
            uVar10 = local_68.l + sVar15 + 1;
            pcVar11 = local_68.s;
            if (uVar10 < local_68.m) {
LAB_0011df40:
              local_68.s = pcVar11;
              memcpy(local_68.s + local_68.l,pbVar12,sVar15);
              local_68.l = sVar15 + local_68.l;
              local_68.s[local_68.l] = '\0';
            }
            else {
              uVar10 = uVar10 >> 1 | uVar10;
              uVar10 = uVar10 >> 2 | uVar10;
              uVar10 = uVar10 >> 4 | uVar10;
              uVar10 = uVar10 >> 8 | uVar10;
              local_68.m = (uVar10 >> 0x10 | uVar10) + 1;
              local_40 = pbVar12;
              pcVar11 = (char *)realloc(local_68.s,local_68.m);
              pbVar12 = local_40;
              if (pcVar11 != (char *)0x0) goto LAB_0011df40;
            }
            uVar2 = *(uint *)((long)&pbVar7->id + lVar13);
            *(char **)((long)pbVar7 + lVar13 + -0xc) = local_68.s + (uVar2 & 0x7fffffff);
            *(uint *)((long)&pbVar7->id + lVar13) = uVar2 | 0x80000000;
            *(uint *)((long)pbVar7 + lVar13 + -0x1c) = uVar3;
            (line->d).indiv_dirty = 1;
            pbVar12 = local_48;
          }
        }
        uVar16 = uVar16 + 1;
        lVar13 = lVar13 + 0x20;
      } while (uVar16 < (byte)line->field_0x14);
    }
  }
  return 0;
}

Assistant:

int bcf_translate(const bcf_hdr_t *dst_hdr, bcf_hdr_t *src_hdr, bcf1_t *line)
{
    int i;
    if ( line->errcode )
    {
        fprintf(stderr,"[%s:%d %s] Unchecked error (%d), exiting.\n", __FILE__,__LINE__,__FUNCTION__,line->errcode);
        exit(1);
    }
    if ( src_hdr->ntransl==-1 ) return 0;    // no need to translate, all tags have the same id
    if ( !src_hdr->ntransl )  // called for the first time, see what needs translating
    {
        int dict;
        for (dict=0; dict<2; dict++)    // BCF_DT_ID and BCF_DT_CTG
        {
            src_hdr->transl[dict] = (int*) malloc(src_hdr->n[dict]*sizeof(int));
            for (i=0; i<src_hdr->n[dict]; i++)
            {
                if ( !src_hdr->id[dict][i].key || !dst_hdr->id[dict][i].key )    // gap left after removed BCF header lines
                    src_hdr->transl[dict][i] = -1;
                else if ( i>=dst_hdr->n[dict] || strcmp(src_hdr->id[dict][i].key,dst_hdr->id[dict][i].key) )
                {
                    src_hdr->transl[dict][i] = bcf_hdr_id2int(dst_hdr,dict,src_hdr->id[dict][i].key);
                    src_hdr->ntransl++;
                }
                else
                    src_hdr->transl[dict][i] = -1;
            }
        }
        if ( !src_hdr->ntransl )
        {
            free(src_hdr->transl[0]); src_hdr->transl[0] = NULL;
            free(src_hdr->transl[1]); src_hdr->transl[1] = NULL;
            src_hdr->ntransl = -1;
        }
        if ( src_hdr->ntransl==-1 ) return 0;
    }
    bcf_unpack(line,BCF_UN_ALL);

    // CHROM
    if ( src_hdr->transl[BCF_DT_CTG][line->rid] >=0 ) line->rid = src_hdr->transl[BCF_DT_CTG][line->rid];

    // FILTER
    for (i=0; i<line->d.n_flt; i++)
    {
        int src_id = line->d.flt[i];
        if ( src_hdr->transl[BCF_DT_ID][src_id] >=0 )
            line->d.flt[i] = src_hdr->transl[BCF_DT_ID][src_id];
        line->d.shared_dirty |= BCF1_DIRTY_FLT;
    }

    // INFO
    for (i=0; i<line->n_info; i++)
    {
        int src_id = line->d.info[i].key;
        int dst_id = src_hdr->transl[BCF_DT_ID][src_id];
        if ( dst_id<0 ) continue;
        int src_size = src_id>>7 ? ( src_id>>15 ? BCF_BT_INT32 : BCF_BT_INT16) : BCF_BT_INT8;
        int dst_size = dst_id>>7 ? ( dst_id>>15 ? BCF_BT_INT32 : BCF_BT_INT16) : BCF_BT_INT8;
        if ( src_size==dst_size )   // can overwrite
        {
            line->d.info[i].key = dst_id;
            uint8_t *vptr = line->d.info[i].vptr - line->d.info[i].vptr_off;
            if ( dst_size==BCF_BT_INT8 ) { vptr[1] = (uint8_t)dst_id; }
            else if ( dst_size==BCF_BT_INT16 ) { *(uint16_t*)vptr = (uint16_t)dst_id; }
            else { *(uint32_t*)vptr = (uint32_t)dst_id; }
        }
        else    // must realloc
        {
            bcf_info_t *info = &line->d.info[i];
            assert( !info->vptr_free );
            kstring_t str = {0,0,0};
            bcf_enc_int1(&str, dst_id);
            bcf_enc_size(&str, info->len,info->type);
            info->vptr_off = str.l;
            kputsn((char*)info->vptr, info->vptr_len, &str);
            info->vptr = (uint8_t*)str.s + info->vptr_off;
            info->vptr_free = 1;
            info->key = dst_id;
            line->d.shared_dirty |= BCF1_DIRTY_INF;
        }
    }

    // FORMAT
    for (i=0; i<line->n_fmt; i++)
    {
        int src_id = line->d.fmt[i].id;
        int dst_id = src_hdr->transl[BCF_DT_ID][src_id];
        if ( dst_id<0 ) continue;
        int src_size = src_id>>7 ? ( src_id>>15 ? BCF_BT_INT32 : BCF_BT_INT16) : BCF_BT_INT8;
        int dst_size = dst_id>>7 ? ( dst_id>>15 ? BCF_BT_INT32 : BCF_BT_INT16) : BCF_BT_INT8;
        if ( src_size==dst_size )   // can overwrite
        {
            line->d.fmt[i].id = dst_id;
            uint8_t *p = line->d.fmt[i].p - line->d.fmt[i].p_off;    // pointer to the vector size (4bits) and BT type (4bits)
            if ( dst_size==BCF_BT_INT8 ) { p[1] = dst_id; }
            else if ( dst_size==BCF_BT_INT16 ) { uint8_t *x = (uint8_t*) &dst_id; p[1] = x[0]; p[2] = x[1]; }
            else { uint8_t *x = (uint8_t*) &dst_id; p[1] = x[0]; p[2] = x[1]; p[3] = x[2]; p[4] = x[3]; }
        }
        else    // must realloc
        {
            bcf_fmt_t *fmt = &line->d.fmt[i];
            assert( !fmt->p_free );
            kstring_t str = {0,0,0};
            bcf_enc_int1(&str, dst_id);
            bcf_enc_size(&str, fmt->n, fmt->type);
            fmt->p_off = str.l;
            kputsn((char*)fmt->p, fmt->p_len, &str);
            fmt->p = (uint8_t*)str.s + fmt->p_off;
            fmt->p_free = 1;
            fmt->id = dst_id;
            line->d.indiv_dirty = 1;
        }
    }
    return 0;
}